

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# publication.cpp
# Opt level: O0

void __thiscall
miniros::Publication::removeSubscriberLink(Publication *this,SubscriberLinkPtr *sub_link)

{
  bool bVar1;
  uint uVar2;
  element_type *peVar3;
  long in_RDI;
  const_iterator __first;
  iterator it;
  scoped_lock<std::mutex> lock;
  SubscriberLinkPtr link;
  mutex_type *in_stack_ffffffffffffff58;
  __normal_iterator<std::shared_ptr<miniros::SubscriberLink>_*,_std::vector<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>_>
  *in_stack_ffffffffffffff60;
  shared_ptr<miniros::SubscriberLink> *this_00;
  shared_ptr<miniros::SubscriberLink> *in_stack_ffffffffffffff68;
  __normal_iterator<std::shared_ptr<miniros::SubscriberLink>_*,_std::vector<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>_>
  in_stack_ffffffffffffff70;
  shared_ptr<miniros::SubscriberLink> local_40;
  SubscriberLinkPtr *in_stack_ffffffffffffffd8;
  Publication *in_stack_ffffffffffffffe0;
  
  std::shared_ptr<miniros::SubscriberLink>::shared_ptr
            ((shared_ptr<miniros::SubscriberLink> *)0x489231);
  std::scoped_lock<std::mutex>::scoped_lock
            ((scoped_lock<std::mutex> *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  if ((*(byte *)(in_RDI + 0x138) & 1) == 0) {
    peVar3 = std::
             __shared_ptr_access<miniros::SubscriberLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<miniros::SubscriberLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x489287);
    uVar2 = (*peVar3->_vptr_SubscriberLink[6])();
    if ((uVar2 & 1) != 0) {
      *(int *)(in_RDI + 0x178) = *(int *)(in_RDI + 0x178) + -1;
    }
    __first._M_current = (shared_ptr<miniros::SubscriberLink> *)(in_RDI + 0xf8);
    std::
    vector<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>
    ::begin((vector<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>
             *)in_stack_ffffffffffffff58);
    std::
    vector<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>
    ::end((vector<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>
           *)in_stack_ffffffffffffff58);
    local_40.super___shared_ptr<miniros::SubscriberLink,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         std::
         find<__gnu_cxx::__normal_iterator<std::shared_ptr<miniros::SubscriberLink>*,std::vector<std::shared_ptr<miniros::SubscriberLink>,std::allocator<std::shared_ptr<miniros::SubscriberLink>>>>,std::shared_ptr<miniros::SubscriberLink>>
                   ((__normal_iterator<std::shared_ptr<miniros::SubscriberLink>_*,_std::vector<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>_>
                     )__first._M_current,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    std::
    vector<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>
    ::end((vector<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>
           *)in_stack_ffffffffffffff58);
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffff60,
                       (__normal_iterator<std::shared_ptr<miniros::SubscriberLink>_*,_std::vector<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>_>
                        *)in_stack_ffffffffffffff58);
    if (bVar1) {
      this_00 = &local_40;
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<miniros::SubscriberLink>_*,_std::vector<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>_>
      ::operator*((__normal_iterator<std::shared_ptr<miniros::SubscriberLink>_*,_std::vector<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>_>
                   *)this_00);
      std::shared_ptr<miniros::SubscriberLink>::operator=
                (this_00,(shared_ptr<miniros::SubscriberLink> *)in_stack_ffffffffffffff58);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<miniros::SubscriberLink>const*,std::vector<std::shared_ptr<miniros::SubscriberLink>,std::allocator<std::shared_ptr<miniros::SubscriberLink>>>>
      ::__normal_iterator<std::shared_ptr<miniros::SubscriberLink>*>
                ((__normal_iterator<const_std::shared_ptr<miniros::SubscriberLink>_*,_std::vector<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>_>
                  *)this_00,
                 (__normal_iterator<std::shared_ptr<miniros::SubscriberLink>_*,_std::vector<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>_>
                  *)in_stack_ffffffffffffff58);
      std::
      vector<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>
      ::erase((vector<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>
               *)in_stack_ffffffffffffff70._M_current,__first);
    }
    local_40.super___shared_ptr<miniros::SubscriberLink,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi._0_4_ = 0;
  }
  else {
    local_40.super___shared_ptr<miniros::SubscriberLink,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi._0_4_ = 1;
  }
  std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x4893c9);
  if ((int)local_40.super___shared_ptr<miniros::SubscriberLink,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi == 0) {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&stack0xffffffffffffffe0);
    if (bVar1) {
      peerDisconnect(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    }
    local_40.super___shared_ptr<miniros::SubscriberLink,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi._0_4_ = 0;
  }
  std::shared_ptr<miniros::SubscriberLink>::~shared_ptr
            ((shared_ptr<miniros::SubscriberLink> *)0x489411);
  return;
}

Assistant:

void Publication::removeSubscriberLink(const SubscriberLinkPtr& sub_link)
{
  SubscriberLinkPtr link;
  {
    std::scoped_lock<std::mutex> lock(subscriber_links_mutex_);

    if (dropped_)
    {
      return;
    }

    if (sub_link->isIntraprocess())
    {
      --intraprocess_subscriber_count_;
    }

    V_SubscriberLink::iterator it = std::find(subscriber_links_.begin(), subscriber_links_.end(), sub_link);
    if (it != subscriber_links_.end())
    {
      link = *it;
      subscriber_links_.erase(it);
    }
  }

  if (link)
  {
    peerDisconnect(link);
  }
}